

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O0

int lua_cpcall(lua_State *L,lua_CFunction func,void *ud)

{
  byte bVar1;
  undefined4 *puVar2;
  int iVar3;
  ulong uVar4;
  GCstr *pGVar5;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  int status;
  uint8_t oldh;
  global_State *g;
  undefined4 in_stack_ffffffffffffff70;
  undefined3 in_stack_ffffffffffffff74;
  byte bVar6;
  
  uVar4 = (ulong)*(uint *)(in_RDI + 8);
  bVar1 = *(byte *)(uVar4 + 0x109);
  bVar6 = bVar1 & 0xf0;
  if (*(int *)(uVar4 + 400) != 0) {
    puVar2 = *(undefined4 **)(in_RDI + 0x18);
    *(undefined4 **)(in_RDI + 0x18) = puVar2 + 2;
    pGVar5 = lj_err_str((lua_State *)
                        (CONCAT44(CONCAT13(bVar1,in_stack_ffffffffffffff74),
                                  in_stack_ffffffffffffff70) & 0xf0ffffffffffffff),
                        (ErrMsg)((ulong)puVar2 >> 0x20));
    *puVar2 = (int)pGVar5;
    puVar2[1] = 0xfffffffb;
    if (*(long *)(uVar4 + 0x178) != 0) {
      (**(code **)(uVar4 + 0x178))(in_RDI);
    }
    exit(1);
  }
  *(uint *)(uVar4 + 0x31c) = *(uint *)(uVar4 + 0x31c) & 0xffffffef;
  iVar3 = lj_vm_cpcall(in_RDI,in_RSI,in_RDX,cpcall);
  if (iVar3 != 0) {
    *(byte *)(uVar4 + 0x109) = *(byte *)(uVar4 + 0x109) & 0xf | bVar6;
  }
  return iVar3;
}

Assistant:

LUA_API int lua_cpcall(lua_State *L, lua_CFunction func, void *ud)
{
  global_State *g = G(L);
  uint8_t oldh = hook_save(g);
  int status;
  lj_checkapi(L->status == LUA_OK || L->status == LUA_ERRERR,
	      "thread called in wrong state %d", L->status);
  /* Forbid Lua world re-entrancy while running the trace */
  if (tvref(g->jit_base)) {
    setstrV(L, L->top++, lj_err_str(L, LJ_ERR_JITCALL));
    if (g->panic) g->panic(L);
    exit(EXIT_FAILURE);
  }
  lj_trace_abort(g);  /* Never record across Lua VM entrance */
  status = lj_vm_cpcall(L, func, ud, cpcall);
  if (status) hook_restore(g, oldh);
  return status;
}